

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

string * __thiscall
cmCTestVC::ComputeCommandLine_abi_cxx11_(string *__return_storage_ptr__,cmCTestVC *this,char **cmd)

{
  ostream *poVar1;
  char *pcVar2;
  char **arg;
  ostringstream line;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pcVar2 = "";
  for (; this->_vptr_cmCTestVC != (_func_int **)0x0; this = (cmCTestVC *)&this->CTest) {
    poVar1 = std::operator<<((ostream *)local_1a0,pcVar2);
    poVar1 = std::operator<<(poVar1,"\"");
    poVar1 = std::operator<<(poVar1,(char *)this->_vptr_cmCTestVC);
    std::operator<<(poVar1,"\"");
    pcVar2 = " ";
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestVC::ComputeCommandLine(char const* const* cmd)
{
  std::ostringstream line;
  const char* sep = "";
  for(const char* const* arg = cmd; *arg; ++arg)
    {
    line << sep << "\"" << *arg << "\"";
    sep = " ";
    }
  return line.str();
}